

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

void __thiscall ON_SHA1_Hash::Dump(ON_SHA1_Hash *this,ON_TextLog *text_log)

{
  ON_wString this_00;
  bool bVar1;
  wchar_t *pwVar2;
  ON_SHA1_Hash local_38;
  ON_wString local_20;
  ON_wString sha1_hash;
  ON_TextLog *text_log_local;
  ON_SHA1_Hash *this_local;
  
  sha1_hash.m_s = (wchar_t *)text_log;
  ON_wString::ON_wString(&local_20);
  bVar1 = ::operator==(&ZeroDigest,this);
  if (bVar1) {
    ON_wString::operator=(&local_20,L"ZeroDigest");
  }
  else {
    bVar1 = ::operator==(&EmptyContentHash,this);
    if (bVar1) {
      ON_wString::operator=(&local_20,L"EmptyContentHash");
    }
    else {
      ToString(&local_38,SUB81(this,0));
      ON_wString::operator=(&local_20,(ON_wString *)&local_38);
      ON_wString::~ON_wString((ON_wString *)&local_38);
    }
  }
  this_00.m_s = sha1_hash.m_s;
  pwVar2 = ON_wString::operator_cast_to_wchar_t_(&local_20);
  ON_TextLog::Print((ON_TextLog *)this_00.m_s,L"ON_SHA1_Hash::%ls",pwVar2);
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_SHA1_Hash::Dump(
class ON_TextLog& text_log
  ) const
{
  ON_wString sha1_hash;
  if ( ON_SHA1_Hash::ZeroDigest == *this )
    sha1_hash = L"ZeroDigest";
  else if ( ON_SHA1_Hash::EmptyContentHash == *this )
    sha1_hash = L"EmptyContentHash";
  else 
    sha1_hash = ToString(true);
  text_log.Print(L"ON_SHA1_Hash::%ls",static_cast<const wchar_t*>(sha1_hash));
}